

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar4;
  undefined7 uVar6;
  text *ptVar5;
  undefined4 in_register_0000003c;
  text *ptVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  anon_class_1_0_00000001 hidden;
  text local_108;
  text local_e8;
  text local_c8;
  text local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  text local_70;
  text local_50;
  
  ptVar7 = (text *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ptVar5 = &local_a8;
    std::__cxx11::string::string((string *)ptVar5,(string *)ptVar7);
    bVar2 = select::anon_class_1_0_00000001::operator()(&hidden,ptVar5);
    uVar4 = (uint)CONCAT71(extraout_var,bVar2);
LAB_00107c2a:
    uVar4 = uVar4 ^ 1;
    std::__cxx11::string::~string((string *)ptVar5);
  }
  else {
    bVar2 = false;
    ptVar5 = ptVar7;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __readfds->fds_bits[1];
    do {
      do {
        __lhs = pbVar1 + -1;
        if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __readfds->fds_bits[0]) {
          if (bVar2) {
            ptVar5 = &local_108;
            std::__cxx11::string::string((string *)ptVar5,(string *)ptVar7);
            bVar2 = select::anon_class_1_0_00000001::operator()(&hidden,ptVar5);
            uVar4 = (uint)CONCAT71(extraout_var_00,bVar2);
            goto LAB_00107c2a;
          }
          goto LAB_00107c65;
        }
        bVar2 = std::operator==(__lhs,"@");
        uVar6 = (undefined7)((ulong)ptVar5 >> 8);
        if ((bVar2) || (bVar2 = std::operator==(__lhs,"*"), bVar2)) {
          return (int)CONCAT71(uVar6,1);
        }
        std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
        std::__cxx11::string::string((string *)&local_c8,(string *)ptVar7);
        ptVar5 = (text *)CONCAT71(uVar6,1);
        bVar2 = search(&local_50,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar2) {
          return (int)ptVar5;
        }
        bVar2 = *(__lhs->_M_dataplus)._M_p == '!';
        pbVar1 = __lhs;
      } while (!bVar2);
      ptVar5 = &local_70;
      std::__cxx11::string::substr((ulong)ptVar5,(ulong)__lhs);
      std::__cxx11::string::string((string *)&local_e8,(string *)ptVar7);
      bVar3 = search(ptVar5,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)ptVar5);
    } while (!bVar3);
LAB_00107c65:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

inline bool select( text name, texts include )
{
    auto none = []( texts args ) { return args.size() == 0; };

#if lest_FEATURE_REGEX_SEARCH
    auto hidden = []( text arg ){ return match( { "\\[\\..*", "\\[hide\\]" }, arg ); };
#else
    auto hidden = []( text arg ){ return match( { "[.", "[hide]" }, arg ); };
#endif

    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( auto pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        auto & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}